

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

int http_server_main(http_server_t *server,void *data)

{
  uint uVar1;
  http_client_t *phVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ssize_t sVar7;
  undefined8 uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  http_client_t *phVar14;
  ulong uVar15;
  fd_set fds;
  char buf [256];
  timeval local_1c8;
  fd_set local_1b8;
  char local_138 [264];
  
  http_server_assert(server);
  local_1c8.tv_sec = 0;
  local_1c8.tv_usec = 0;
  local_1b8.fds_bits[0] = 0;
  local_1b8.fds_bits[1] = 0;
  local_1b8.fds_bits[2] = 0;
  local_1b8.fds_bits[3] = 0;
  local_1b8.fds_bits[4] = 0;
  local_1b8.fds_bits[5] = 0;
  local_1b8.fds_bits[6] = 0;
  local_1b8.fds_bits[7] = 0;
  local_1b8.fds_bits[8] = 0;
  local_1b8.fds_bits[9] = 0;
  local_1b8.fds_bits[10] = 0;
  local_1b8.fds_bits[0xb] = 0;
  local_1b8.fds_bits[0xc] = 0;
  local_1b8.fds_bits[0xd] = 0;
  local_1b8.fds_bits[0xe] = 0;
  local_1b8.fds_bits[0xf] = 0;
  iVar6 = server->fd;
  iVar3 = iVar6 + 0x3f;
  if (-1 < iVar6) {
    iVar3 = iVar6;
  }
  local_1b8.fds_bits[iVar3 >> 6] = local_1b8.fds_bits[iVar3 >> 6] | 1L << ((byte)iVar6 & 0x3f);
  uVar1 = server->num_clients;
  if ((ulong)uVar1 != 0) {
    phVar2 = server->clients;
    lVar10 = 0;
    do {
      iVar6 = *(int *)(phVar2->buf + lVar10 + -0x10);
      if (iVar6 != -1) {
        iVar3 = iVar6 + 0x3f;
        if (-1 < iVar6) {
          iVar3 = iVar6;
        }
        local_1b8.fds_bits[iVar3 >> 6] = local_1b8.fds_bits[iVar3 >> 6] | 1L << ((byte)iVar6 & 0x3f)
        ;
      }
      lVar10 = lVar10 + 0x2018;
    } while ((ulong)uVar1 * 0x2018 - lVar10 != 0);
  }
  iVar3 = select(0x400,&local_1b8,(fd_set *)0x0,(fd_set *)0x0,&local_1c8);
  iVar6 = 0;
  if (-1 < iVar3) {
    uVar1 = server->fd;
    uVar5 = uVar1 + 0x3f;
    if (-1 < (int)uVar1) {
      uVar5 = uVar1;
    }
    if ((((ulong)local_1b8.fds_bits[(int)uVar5 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) ||
       (iVar3 = http_server_accept(server), iVar6 = 0, iVar3 != 0)) {
      if (server->num_clients != 0) {
        lVar10 = 0x10;
        uVar15 = 0;
        do {
          phVar2 = server->clients;
          uVar1 = phVar2[uVar15].fd;
          if (uVar1 != 0xffffffff) {
            uVar5 = uVar1 + 0x3f;
            if (-1 < (int)uVar1) {
              uVar5 = uVar1;
            }
            if (((ulong)local_1b8.fds_bits[(int)uVar5 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
              phVar14 = phVar2 + uVar15;
              http_server_assert(server);
              sVar7 = read(phVar14->fd,phVar14->buf + phVar14->len,(long)(0x1ffb - phVar14->len));
              if (0 < (int)sVar7) {
                phVar14->in = phVar14->in + (int)sVar7;
                if (1 < phVar14->found) goto LAB_00105caa;
                time((time_t *)0x0);
                iVar6 = phVar14->found;
                uVar1 = phVar14->len;
                uVar5 = uVar1;
                if (iVar6 < 2) {
                  uVar9 = phVar14->in;
                  if (phVar14->in < (int)uVar1) {
                    uVar9 = uVar1;
                  }
                  lVar11 = 0;
                  uVar4 = uVar1;
                  do {
                    uVar5 = uVar9;
                    if ((long)(int)uVar9 - (long)(int)uVar1 == lVar11) break;
                    if (phVar2->buf[lVar11 + (int)uVar1 + lVar10 + -0x10] != '\r') {
                      iVar3 = 0;
                      if (phVar2->buf[lVar11 + (int)uVar1 + lVar10 + -0x10] == '\n') {
                        iVar3 = iVar6 + 1;
                      }
                      iVar6 = iVar3;
                      phVar14->found = iVar6;
                    }
                    uVar5 = uVar4 + 1;
                    phVar14->len = uVar5;
                    lVar11 = lVar11 + 1;
                    uVar4 = uVar5;
                  } while (iVar6 < 2);
                }
                if ((int)uVar5 < 10) {
                  uVar8 = 400;
                  pcVar12 = "Bad Request";
                  pcVar13 = "Not HTTP";
                }
                else {
                  phVar14->buf[uVar5] = '\0';
                  iVar6 = strncasecmp(phVar14->buf,"GET /",5);
                  if (iVar6 == 0) {
                    sVar7 = write(phVar14->fd,"HTTP/1.0 200 OK\r\n\r\n",0x13);
                    if (sVar7 != 0x13) goto LAB_00105c9c;
                    if ((server->callback == (http_client_callback_t *)0x0) ||
                       (iVar6 = (*server->callback)(phVar14,data), -1 < iVar6)) goto LAB_00105caa;
                    uVar8 = 500;
                    pcVar12 = "Server Internal Error";
                    pcVar13 = "Callback returned error";
                  }
                  else {
                    uVar8 = 400;
                    pcVar12 = "Bad Request";
                    pcVar13 = "Unsupported HTTP Method";
                  }
                }
                iVar6 = snprintf(local_138,0x100,
                                 "HTTP/1.0 %lu %s\r\nConnection: close\r\n\r\n%s\r\n",uVar8,pcVar12,
                                 pcVar13);
                write(phVar14->fd,local_138,(long)iVar6);
              }
LAB_00105c9c:
              http_client_close(server,server->clients + uVar15);
            }
          }
LAB_00105caa:
          uVar15 = uVar15 + 1;
          lVar10 = lVar10 + 0x2018;
        } while (uVar15 < server->num_clients);
      }
      http_server_check(server);
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

int http_server_main(http_server_t *server, void *data) {
  http_server_assert(server);

  int i;
  
  fd_set fds;
  struct timeval tout;
  
  tout.tv_usec = 0;
  tout.tv_sec = 0;
  
  FD_ZERO(&fds);
  
  /* Select the listening HTTP socket. */
  FD_SET(server->fd, &fds);
  
  /* Select all active client sockets. */
  for (i = 0; i < server->num_clients; i++) {
    if (server->clients[i].fd != -1) {
      FD_SET(server->clients[i].fd, &fds);
    }
  }
  
  if (select(FD_SETSIZE, &fds, NULL, NULL, &tout) < 0) {
    return 0;
  }
  
  /* Accept incoming connections. */
  if (FD_ISSET(server->fd, &fds)) {
    if (!http_server_accept(server))
      return 0;
  }
  
  /* Read incoming client data. */
  for (i = 0; i < server->num_clients; i++) {
    if ((server->clients[i].fd != -1) &&
        (FD_ISSET(server->clients[i].fd, &fds))) {
      if (http_handle_client(server, server->clients + i, data) < 0) {
        http_client_close(server, server->clients + i);
      }
    }
  }
  
  /* Check for client timeouts. */
  http_server_check(server);
  
  return 1;
}